

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

int Pdr_SetContains(Pdr_Set_t *pOld,Pdr_Set_t *pNew)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = pOld->nLits;
  if ((long)(int)uVar1 < 1) {
    __assert_fail("pOld->nLits > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                  ,0x132,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
  }
  uVar2 = pNew->nLits;
  if ((long)(int)uVar2 < 1) {
    __assert_fail("pNew->nLits > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                  ,0x133,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
  }
  iVar4 = 0;
  if ((uVar2 <= uVar1) && (iVar4 = 0, (pNew->Sign & ~pOld->Sign) == 0)) {
    lVar5 = (long)(int)uVar2 * 4 + 0x10;
    lVar6 = (long)(int)uVar1 * 4 + 0x10;
    do {
      if (lVar6 < 0x14) {
        return 0;
      }
      iVar4 = *(int *)((long)&pNew->Sign + lVar5);
      if (iVar4 == -1) {
        __assert_fail("*pNewInt != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                      ,0x13e,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
      }
      iVar3 = *(int *)((long)&pOld->Sign + lVar6);
      if (iVar3 == -1) {
        __assert_fail("*pOldInt != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                      ,0x13f,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
      }
      if (iVar4 == iVar3) {
        lVar5 = lVar5 + -4;
      }
      else if (iVar3 <= iVar4) {
        return 0;
      }
      lVar6 = lVar6 + -4;
    } while (0x13 < lVar5);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Pdr_SetContains( Pdr_Set_t * pOld, Pdr_Set_t * pNew )
{
    int * pOldInt, * pNewInt;
    assert( pOld->nLits > 0 );
    assert( pNew->nLits > 0 );
    if ( pOld->nLits < pNew->nLits )
        return 0;
    if ( (pOld->Sign & pNew->Sign) != pNew->Sign )
        return 0;
    pOldInt = pOld->Lits + pOld->nLits - 1;
    pNewInt = pNew->Lits + pNew->nLits - 1;
    while ( pNew->Lits <= pNewInt )
    {
        if ( pOld->Lits > pOldInt )
            return 0;
        assert( *pNewInt != -1 );
        assert( *pOldInt != -1 );
        if ( *pNewInt == *pOldInt )
            pNewInt--, pOldInt--;
        else if ( *pNewInt < *pOldInt )
            pOldInt--;
        else
            return 0;
    }
    return 1;
}